

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

void obj_from_char(OBJ_DATA *obj)

{
  string_view fmt;
  string_view fmt_00;
  int iVar1;
  OBJ_DATA *in_RDI;
  undefined7 unaff_retaddr;
  undefined1 unaff_retaddr_00;
  OBJ_DATA *in_stack_00000008;
  OBJ_DATA *prev;
  CHAR_DATA *ch;
  OBJ_DATA *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  OBJ_DATA *pOVar2;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe0;
  CHAR_DATA *this;
  
  this = in_RDI->carried_by;
  if (this == (CHAR_DATA *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    fmt._M_str._7_1_ = unaff_retaddr_00;
    fmt._M_str._0_7_ = unaff_retaddr;
    fmt._M_len = (size_t)in_RDI;
    CLogger::Debug<>((CLogger *)this,fmt);
  }
  else {
    if (in_RDI->wear_loc != -1) {
      unequip_char((CHAR_DATA *)prev,in_stack_00000008,(bool)unaff_retaddr_00);
    }
    if (this->carrying == in_RDI) {
      this->carrying = in_RDI->next_content;
    }
    else {
      for (pOVar2 = this->carrying; pOVar2 != (OBJ_DATA *)0x0; pOVar2 = pOVar2->next_content) {
        if (pOVar2->next_content == in_RDI) {
          pOVar2->next_content = in_RDI->next_content;
          break;
        }
      }
      if (pOVar2 == (OBJ_DATA *)0x0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffffe0,(char *)0x0);
        fmt_00._M_str._7_1_ = unaff_retaddr_00;
        fmt_00._M_str._0_7_ = unaff_retaddr;
        fmt_00._M_len = (size_t)in_RDI;
        CLogger::Warn<>((CLogger *)this,fmt_00);
      }
    }
    in_RDI->carried_by = (CHAR_DATA *)0x0;
    in_RDI->next_content = (OBJ_DATA *)0x0;
    iVar1 = get_obj_number(in_RDI);
    this->carry_number = this->carry_number - (short)iVar1;
    iVar1 = get_obj_weight(in_stack_ffffffffffffffd0);
    this->carry_weight = this->carry_weight - (short)iVar1;
  }
  return;
}

Assistant:

void obj_from_char(OBJ_DATA *obj)
{
	CHAR_DATA *ch;

	if ((ch = obj->carried_by) == nullptr)
	{
		RS.Logger.Debug("Obj_from_char: null ch.");
		return;
	}

	if (obj->wear_loc != WEAR_NONE)
		unequip_char(ch, obj, true);

	if (ch->carrying == obj)
	{
		ch->carrying = obj->next_content;
	}
	else
	{
		OBJ_DATA *prev;

		for (prev = ch->carrying; prev != nullptr; prev = prev->next_content)
		{
			if (prev->next_content == obj)
			{
				prev->next_content = obj->next_content;
				break;
			}
		}

		if (prev == nullptr)
			RS.Logger.Warn("Obj_from_char: obj not in list.");
	}

	obj->carried_by = nullptr;
	obj->next_content = nullptr;
	ch->carry_number -= get_obj_number(obj);
	ch->carry_weight -= get_obj_weight(obj);
}